

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt64x2Operation.cpp
# Opt level: O3

void Js::SIMDInt64x2Operation::OpTrunc<unsigned_long>(SIMDValue *dst,SIMDValue *src)

{
  double dVar1;
  Type TVar2;
  
  dVar1 = (src->field_0).f64[0];
  if (0.0 < dVar1) {
    TVar2 = -NAN;
    if (dVar1 < 1.8446744073709552e+19) {
      TVar2 = (Type)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
    }
  }
  else {
    TVar2 = 0.0;
  }
  (dst->field_0).f64[0] = TVar2;
  dVar1 = (src->field_0).f64[1];
  if (0.0 < dVar1) {
    TVar2 = -NAN;
    if (dVar1 < 1.8446744073709552e+19) {
      TVar2 = (Type)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
    }
  }
  else {
    TVar2 = 0.0;
  }
  (dst->field_0).f64[1] = TVar2;
  return;
}

Assistant:

void SIMDInt64x2Operation::OpTrunc(SIMDValue* dst, SIMDValue* src)
    {
        T convertedVal;
        dst->i64[0] = IsInRange(src->f64[0], convertedVal) ? (T)src->f64[0] : convertedVal;
        dst->i64[1] = IsInRange(src->f64[1], convertedVal) ? (T)src->f64[1] : convertedVal;
    }